

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdmerge.c
# Opt level: O0

void h2v1_merged_upsample
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION in_row_group_ctr,
               JSAMPARRAY output_buf)

{
  int iVar1;
  int iVar2;
  jpeg_upsampler *pjVar3;
  JSAMPLE *pJVar4;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var5;
  long lVar6;
  _func_void_j_decompress_ptr *p_Var7;
  _func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
  *p_Var8;
  long lVar9;
  long lVar10;
  int iVar11;
  uint uVar12;
  byte *pbVar13;
  INT32 *Cbgtab;
  INT32 *Crgtab;
  int *Cbbtab;
  int *Crrtab;
  JSAMPLE *range_limit;
  byte *pbStack_68;
  JDIMENSION col;
  JSAMPROW inptr2;
  JSAMPROW inptr1;
  JSAMPROW inptr0;
  JSAMPROW outptr;
  int cr;
  int cb;
  int cblue;
  int cgreen;
  int cred;
  int y;
  my_upsample_ptr upsample;
  JSAMPARRAY output_buf_local;
  JDIMENSION in_row_group_ctr_local;
  JSAMPIMAGE input_buf_local;
  j_decompress_ptr cinfo_local;
  
  pjVar3 = cinfo->upsample;
  pJVar4 = cinfo->sample_range_limit;
  p_Var5 = pjVar3[1].upsample;
  lVar6 = *(long *)&pjVar3[1].need_context_rows;
  p_Var7 = pjVar3[2].start_pass;
  p_Var8 = pjVar3[2].upsample;
  inptr1 = (*input_buf)[in_row_group_ctr];
  inptr0 = *output_buf;
  pbStack_68 = input_buf[2][in_row_group_ctr];
  inptr2 = input_buf[1][in_row_group_ctr];
  for (range_limit._4_4_ = cinfo->output_width >> 1; range_limit._4_4_ != 0;
      range_limit._4_4_ = range_limit._4_4_ - 1) {
    iVar1 = *(int *)(p_Var5 + (long)(int)(uint)*pbStack_68 * 4);
    iVar11 = (int)((ulong)(*(long *)(p_Var8 + (long)(int)(uint)*inptr2 * 8) +
                          *(long *)(p_Var7 + (long)(int)(uint)*pbStack_68 * 8)) >> 0x10);
    iVar2 = *(int *)(lVar6 + (long)(int)(uint)*inptr2 * 4);
    pbVar13 = inptr1 + 1;
    uVar12 = (uint)*inptr1;
    *inptr0 = pJVar4[(int)(uVar12 + iVar1)];
    inptr0[1] = pJVar4[(int)(uVar12 + iVar11)];
    inptr0[2] = pJVar4[(int)(uVar12 + iVar2)];
    inptr1 = inptr1 + 2;
    uVar12 = (uint)*pbVar13;
    inptr0[3] = pJVar4[(int)(uVar12 + iVar1)];
    inptr0[4] = pJVar4[(int)(uVar12 + iVar11)];
    inptr0[5] = pJVar4[(int)(uVar12 + iVar2)];
    inptr0 = inptr0 + 6;
    pbStack_68 = pbStack_68 + 1;
    inptr2 = inptr2 + 1;
  }
  if ((cinfo->output_width & 1) != 0) {
    lVar9 = *(long *)(p_Var8 + (long)(int)(uint)*inptr2 * 8);
    lVar10 = *(long *)(p_Var7 + (long)(int)(uint)*pbStack_68 * 8);
    iVar1 = *(int *)(lVar6 + (long)(int)(uint)*inptr2 * 4);
    uVar12 = (uint)*inptr1;
    *inptr0 = pJVar4[(int)(uVar12 + *(int *)(p_Var5 + (long)(int)(uint)*pbStack_68 * 4))];
    inptr0[1] = pJVar4[(int)(uVar12 + (int)((ulong)(lVar9 + lVar10) >> 0x10))];
    inptr0[2] = pJVar4[(int)(uVar12 + iVar1)];
  }
  return;
}

Assistant:

METHODDEF(void)
h2v1_merged_upsample (j_decompress_ptr cinfo,
		      JSAMPIMAGE input_buf, JDIMENSION in_row_group_ctr,
		      JSAMPARRAY output_buf)
{
  my_upsample_ptr upsample = (my_upsample_ptr) cinfo->upsample;
  register int y, cred, cgreen, cblue;
  int cb, cr;
  register JSAMPROW outptr;
  JSAMPROW inptr0, inptr1, inptr2;
  JDIMENSION col;
  /* copy these pointers into registers if possible */
  register JSAMPLE * range_limit = cinfo->sample_range_limit;
  int * Crrtab = upsample->Cr_r_tab;
  int * Cbbtab = upsample->Cb_b_tab;
  INT32 * Crgtab = upsample->Cr_g_tab;
  INT32 * Cbgtab = upsample->Cb_g_tab;
  SHIFT_TEMPS

  inptr0 = input_buf[0][in_row_group_ctr];
  inptr1 = input_buf[1][in_row_group_ctr];
  inptr2 = input_buf[2][in_row_group_ctr];
  outptr = output_buf[0];
  /* Loop for each pair of output pixels */
  for (col = cinfo->output_width >> 1; col > 0; col--) {
    /* Do the chroma part of the calculation */
    cb = GETJSAMPLE(*inptr1++);
    cr = GETJSAMPLE(*inptr2++);
    cred = Crrtab[cr];
    cgreen = (int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr], SCALEBITS);
    cblue = Cbbtab[cb];
    /* Fetch 2 Y values and emit 2 pixels */
    y  = GETJSAMPLE(*inptr0++);
    outptr[RGB_RED] =   range_limit[y + cred];
    outptr[RGB_GREEN] = range_limit[y + cgreen];
    outptr[RGB_BLUE] =  range_limit[y + cblue];
    outptr += RGB_PIXELSIZE;
    y  = GETJSAMPLE(*inptr0++);
    outptr[RGB_RED] =   range_limit[y + cred];
    outptr[RGB_GREEN] = range_limit[y + cgreen];
    outptr[RGB_BLUE] =  range_limit[y + cblue];
    outptr += RGB_PIXELSIZE;
  }
  /* If image width is odd, do the last output column separately */
  if (cinfo->output_width & 1) {
    cb = GETJSAMPLE(*inptr1);
    cr = GETJSAMPLE(*inptr2);
    cred = Crrtab[cr];
    cgreen = (int) RIGHT_SHIFT(Cbgtab[cb] + Crgtab[cr], SCALEBITS);
    cblue = Cbbtab[cb];
    y  = GETJSAMPLE(*inptr0);
    outptr[RGB_RED] =   range_limit[y + cred];
    outptr[RGB_GREEN] = range_limit[y + cgreen];
    outptr[RGB_BLUE] =  range_limit[y + cblue];
  }
}